

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O2

int Teleport::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  int iVar1;
  EffectData *pEVar2;
  SharedMemoryHandle *pSVar3;
  Parameter *pPVar4;
  uint uVar5;
  char *__assertion;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<Teleport::EffectData>(state);
  if (index < 8) {
    if (index < 4) {
      pPVar4 = (Parameter *)(pEVar2->p + index);
    }
    else {
      uVar5 = (uint)pEVar2->p[0];
      if ((int)uVar5 < 0) {
        __assertion = "stream >= 0";
        uVar5 = 0x66;
LAB_0011974e:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/Plugin_Teleport.cpp"
                      ,uVar5,
                      "int Teleport::SetFloatParameterCallback(UnityAudioEffectState *, int, float)"
                     );
      }
      if (7 < uVar5) {
        __assertion = "stream < Teleport::NUMSTREAMS";
        uVar5 = 0x67;
        goto LAB_0011974e;
      }
      pSVar3 = GetSharedMemory();
      pPVar4 = pSVar3->data->streams[uVar5].params + (index - 4);
      pPVar4->changed = 1;
    }
    pPVar4->value = value;
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;

        if (index >= P_PARAM1 && index <= P_PARAM4)
        {
            int stream = (int)data->p[P_STREAM];
            assert(stream >= 0);
            assert(stream < Teleport::NUMSTREAMS);

            SharedMemoryHandle& shared = GetSharedMemory();
            Stream& s = shared->streams[stream];

            s.params[index - P_PARAM1].changed = 1;
            s.params[index - P_PARAM1].value = value;
        }
        else
            data->p[index] = value;

        return UNITY_AUDIODSP_OK;
    }